

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

RuneStrLite cppjieba::DecodeRuneInString(char *str,size_t len)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lStack_8;
  
  if (len == 0 || str == (char *)0x0) {
LAB_00115665:
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    bVar1 = *str;
    uVar2 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      uVar3 = 0x100000000;
      goto LAB_00115723;
    }
    uVar2 = (uint)bVar1;
    if (len < 2 || 0xdf < bVar1) {
      if (len < 3 || 0xef < bVar1) {
        if (len < 4 || 0xf7 < bVar1) goto LAB_00115665;
        uVar2 = ((byte)str[2] & 0x3f) << 6 | ((byte)str[1] & 0x3f | (uVar2 & 7) << 6) << 0xc;
        uVar3 = 0x400000000;
        lStack_8 = 3;
      }
      else {
        uVar2 = ((byte)str[1] & 0x3f | (uVar2 & 0xf) << 6) << 6;
        uVar3 = 0x300000000;
        lStack_8 = 2;
      }
    }
    else {
      uVar2 = (uVar2 & 0x1f) << 6;
      uVar3 = 0x200000000;
      lStack_8 = 1;
    }
    uVar2 = (byte)str[lStack_8] & 0x3f | uVar2;
  }
LAB_00115723:
  return (RuneStrLite)(uVar2 | uVar3);
}

Assistant:

inline RuneStrLite DecodeRuneInString(const char* str, size_t len) {
  RuneStrLite rp(0, 0);
  if (str == NULL || len == 0) {
    return rp;
  }
  if (!(str[0] & 0x80)) { // 0xxxxxxx
    // 7bit, total 7bit
    rp.rune = (uint8_t)(str[0]) & 0x7f;
    rp.len = 1;
  } else if ((uint8_t)str[0] <= 0xdf &&  1 < len) { 
    // 110xxxxxx
    // 5bit, total 5bit
    rp.rune = (uint8_t)(str[0]) & 0x1f;

    // 6bit, total 11bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[1]) & 0x3f;
    rp.len = 2;
  } else if((uint8_t)str[0] <= 0xef && 2 < len) { // 1110xxxxxx
    // 4bit, total 4bit
    rp.rune = (uint8_t)(str[0]) & 0x0f;

    // 6bit, total 10bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[1]) & 0x3f;

    // 6bit, total 16bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[2]) & 0x3f;

    rp.len = 3;
  } else if((uint8_t)str[0] <= 0xf7 && 3 < len) { // 11110xxxx
    // 3bit, total 3bit
    rp.rune = (uint8_t)(str[0]) & 0x07;

    // 6bit, total 9bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[1]) & 0x3f;

    // 6bit, total 15bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[2]) & 0x3f;

    // 6bit, total 21bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[3]) & 0x3f;

    rp.len = 4;
  } else {
    rp.rune = 0;
    rp.len = 0;
  }
  return rp;
}